

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O0

int str_diff_idx(char *a,char *b)

{
  size_t sVar1;
  ulong local_40;
  size_t minlen;
  size_t lenb;
  size_t lena;
  int i;
  char *b_local;
  char *a_local;
  
  if (a == (char *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x83,"int str_diff_idx(const char *, const char *)");
  }
  if (b != (char *)0x0) {
    lena._4_4_ = 0;
    sVar1 = strlen(a);
    local_40 = strlen(b);
    if (sVar1 < local_40) {
      local_40 = sVar1;
    }
    for (; ((ulong)(long)lena._4_4_ < local_40 && (a[lena._4_4_] == b[lena._4_4_]));
        lena._4_4_ = lena._4_4_ + 1) {
    }
    return lena._4_4_;
  }
  __assert_fail("b != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                ,0x84,"int str_diff_idx(const char *, const char *)");
}

Assistant:

int str_diff_idx(const char * a, const char * b)
{
    assert(a != NULL);
    assert(b != NULL);

    int i = 0;

    size_t lena = strlen(a);
    size_t lenb = strlen(b);

    size_t minlen = lena < lenb ? lena : lenb;

    for (; i < minlen; i++)
        if (a[i] != b[i])
            break;

    return i;
}